

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void capnp::_::initTestMessage(Builder builder)

{
  Builder builder_00;
  undefined8 in_stack_ffffffffffffffd0;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  
  memcpy(&stack0xffffffffffffffd0,&stack0x00000008,0x28);
  builder_00._builder.capTable = (CapTableBuilder *)local_20;
  builder_00._builder.segment = (SegmentBuilder *)uStack_28;
  builder_00._builder.data = (void *)uStack_18;
  builder_00._builder.pointers = (WirePointer *)local_10;
  builder_00._builder.dataSize = (int)in_stack_ffffffffffffffd0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_ffffffffffffffd0 >> 0x30);
  anon_unknown_134::genericInitListDefaults<capnproto_test::capnp::test::TestListDefaults::Builder>
            (builder_00);
  return;
}

Assistant:

void initTestMessage(TestListDefaults::Builder builder) { genericInitListDefaults(builder); }